

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushClosure::encode(PushClosure *this,uint8_t *buffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  PushClosure *this_00;
  
  uVar1 = this->numCopied;
  uVar2 = this->numArgs;
  this_00 = this;
  InstructionNode::encodeExtA
            (&this->super_InstructionNode,buffer,
             (long)(((int)(((uint)((int)uVar2 >> 0x1f) >> 0x1d) + uVar2) >> 3) +
                   ((int)(((uint)((int)uVar1 >> 0x1f) >> 0x1d) + uVar1) >> 3) * 0x10));
  InstructionNode::encodeExtB
            (&this_00->super_InstructionNode,buffer,
             (long)(((int)(this->blockEnd->super_InstructionNode).lastPosition -
                    ((int)(this->super_InstructionNode).lastPosition +
                    (int)(this->super_InstructionNode).size)) / 0x100));
  *buffer = 0xfa;
  buffer[1] = (byte)(this->numCopied << 7) |
              (byte)this->numArgs & 7 | (byte)(this->numExtensions << 6);
  buffer[2] = (char)(int)(this->blockEnd->super_InstructionNode).lastPosition -
              ((char)(int)(this->super_InstructionNode).lastPosition +
              (char)(int)(this->super_InstructionNode).size);
  return buffer + 3;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
    	{
            buffer = encodeExtA(buffer, extendAValue());
            buffer = encodeExtB(buffer, extendBValue());

    		*buffer++ = BytecodeSet::PushClosure;
    		*buffer++ =
                ((numExtensions & BytecodeSet::PushClosure_NumExtensionsMask) << BytecodeSet::PushClosure_NumExtensionsShift) |
                ((numArgs & BytecodeSet::PushClosure_NumArgsMask) << BytecodeSet::PushClosure_NumArgsShift) |
                ((numCopied & BytecodeSet::PushClosure_NumCopiedMask) << BytecodeSet::PushClosure_NumCopiedShift);
            *buffer++ = blockSize() & 0xFF;
    		return buffer;
    	}